

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_stats.cpp
# Opt level: O1

BaseStatistics *
duckdb::ListStats::CreateEmpty(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> this;
  LogicalType *other;
  LogicalType LStack_a8;
  LogicalType local_90;
  BaseStatistics local_78;
  
  other = ListType::GetChildType(type);
  LogicalType::LogicalType(&local_90,type);
  BaseStatistics::BaseStatistics(__return_storage_ptr__,&local_90);
  LogicalType::~LogicalType(&local_90);
  __return_storage_ptr__->has_null = false;
  __return_storage_ptr__->has_no_null = true;
  this._M_head_impl =
       (__return_storage_ptr__->child_stats).
       super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  LogicalType::LogicalType(&LStack_a8,other);
  BaseStatistics::CreateEmpty(&local_78,&LStack_a8);
  BaseStatistics::Copy(this._M_head_impl,&local_78);
  BaseStatistics::~BaseStatistics(&local_78);
  LogicalType::~LogicalType(&LStack_a8);
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics ListStats::CreateEmpty(LogicalType type) {
	auto &child_type = ListType::GetChildType(type);
	BaseStatistics result(std::move(type));
	result.InitializeEmpty();
	result.child_stats[0].Copy(BaseStatistics::CreateEmpty(child_type));
	return result;
}